

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_False_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_False_Test *this)

{
  return;
}

Assistant:

TEST(GTestSyntaxTest, False)
{
    if( bool b = false )
        ASSERT_FALSE(b) << b;
    if( bool b = false )
        EXPECT_FALSE(b) << b;
    if( bool b = false )
        INFORM_FALSE(b) << b;
    if( bool b = false )
        ASSUME_FALSE(b) << b;
}